

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsEquality2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsEquality2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *pTVar2;
  long lVar3;
  long lVar4;
  long **pplVar5;
  long lVar6;
  undefined1 *puVar7;
  string shader_source;
  long *local_58 [2];
  long local_48 [2];
  ExpressionsEquality2<glcts::ArraysOfArrays::Interface::ES> *local_38;
  
  lVar6 = 0;
  local_38 = this;
  do {
    lVar3 = 0x2238c78;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar4 = supported_variable_types_map._16_8_;
      do {
        if (*(int *)(Interface::ES::var_types + lVar6 * 4) <= *(int *)(lVar4 + 0x20)) {
          lVar3 = lVar4;
        }
        lVar4 = *(long *)(lVar4 + 0x10 +
                         (ulong)(*(int *)(lVar4 + 0x20) <
                                *(int *)(Interface::ES::var_types + lVar6 * 4)) * 8);
      } while (lVar4 != 0);
    }
    if ((lVar3 == 0x2238c78) ||
       (*(int *)(Interface::ES::var_types + lVar6 * 4) < *(int *)(lVar3 + 0x20))) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xe08);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"struct light {\n    float intensity;\n    int position;\n};\n\n",
               "");
    std::__cxx11::string::_M_append((char *)local_58,shader_start_abi_cxx11_);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    puVar1 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)local_58);
      break;
    case COMPUTE_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar1 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)local_58,*puVar1);
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xdfc);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)local_58,shader_end_abi_cxx11_);
    puVar7 = empty_string_abi_cxx11_;
    pplVar5 = (long **)empty_string_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      puVar7 = default_vertex_shader_source_abi_cxx11_;
      pplVar5 = local_58;
      break;
    case VERTEX_SHADER_TYPE:
      puVar7 = (undefined1 *)local_58;
      goto LAB_00b46f49;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
    case TESSELATION_CONTROL_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      puVar7 = default_vertex_shader_source_abi_cxx11_;
LAB_00b46f49:
      pplVar5 = (long **)default_fragment_shader_source_abi_cxx11_;
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xe04);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(local_38->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
      super_TestNode._vptr_TestNode[9])(local_38,puVar7,pplVar5,1,0);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 0x1c) {
      return;
    }
  } while( true );
}

Assistant:

void ExpressionsEquality2<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int num_var_types = API::n_var_types;

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source = "struct light {\n    float intensity;\n    int position;\n};\n\n";

			shader_source += shader_start;
			shader_source += "    light[][] x =";
			shader_source += "light";
			shader_source += "[][](";
			shader_source += "light";
			shader_source += "[](light(1.0, 1)),";
			shader_source += "light";
			shader_source += "[](light(2.0, 2)));\n\n";
			shader_source += "    light[][] y =";
			shader_source += "light";
			shader_source += "[][](";
			shader_source += "light";
			shader_source += "[](light(3.0, 3)),";
			shader_source += "light";
			shader_source += "[](light(4.0, 4)));\n\n";
			shader_source += "    float result = 0.0;\n\n";
			shader_source += "    if (x == y)\n";
			shader_source += "    {\n";
			shader_source += "        result = 1.0;\n";
			shader_source += "    }\n";
			shader_source += "    if (y != x)\n";
			shader_source += "    {\n";
			shader_source += "        result = 2.0;\n";
			shader_source += "    }\n";

			/* Apply stage specific stuff */
			switch (tested_shader_type)
			{
			case TestCaseBase<API>::VERTEX_SHADER_TYPE:
				shader_source += "\n    gl_Position = vec4(0.0,0.0,0.0,1.0);\n";
				break;
			case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
				shader_source += "\n    gl_FragDepth = result;\n";
				break;
			case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
				break;
			case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
				shader_source += emit_quad;
				break;
			case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
				shader_source += set_tesseation;
				break;
			case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
				break;
			default:
				TCU_FAIL("Unrecognized shader type.");
				break;
			}

			/* End main function */
			shader_source += shader_end;

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}